

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool.cpp
# Opt level: O2

void Function_Pool::Maximum
               (Image *in1,uint32_t startX1,uint32_t startY1,Image *in2,uint32_t startX2,
               uint32_t startY2,Image *out,uint32_t startXOut,uint32_t startYOut,uint32_t width,
               uint32_t height)

{
  FunctionTask local_170;
  
  FunctionTask::FunctionTask(&local_170);
  FunctionTask::Maximum
            (&local_170,in1,startX1,startY1,in2,startX2,startY2,out,startXOut,startYOut,width,height
            );
  FunctionTask::~FunctionTask(&local_170);
  return;
}

Assistant:

void Maximum( const Image & in1, uint32_t startX1, uint32_t startY1, const Image & in2, uint32_t startX2, uint32_t startY2,
                  Image & out, uint32_t startXOut, uint32_t startYOut, uint32_t width, uint32_t height )
    {
        FunctionTask().Maximum( in1, startX1, startY1, in2, startX2, startY2, out, startXOut, startYOut, width, height );
    }